

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFunction<duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>
     ::
     Combine<duckdb::HistogramAggState<duckdb::string_t,duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>,duckdb::HistogramFunction<duckdb::StringMapType<duckdb::OwningStringMap<unsigned_long,std::map<duckdb::string_t,unsigned_long,std::less<duckdb::string_t>,std::allocator<std::pair<duckdb::string_t_const,unsigned_long>>>>>>>
               (HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
                *source,HistogramAggState<duckdb::string_t,_duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
                        *target,AggregateInputData *input_data)

{
  _Base_ptr p_Var1;
  OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
  *pOVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  
  pOVar2 = source->hist;
  if (pOVar2 != (OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
                 *)0x0) {
    if (target->hist ==
        (OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
         *)0x0) {
      pOVar2 = StringMapType<duckdb::OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>_>
               ::CreateEmpty(input_data->allocator);
      target->hist = pOVar2;
      pOVar2 = source->hist;
    }
    for (p_Var4 = (pOVar2->map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pOVar2->map)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4)) {
      p_Var1 = p_Var4[1]._M_left;
      pmVar3 = OwningStringMap<unsigned_long,_std::map<duckdb::string_t,_unsigned_long,_std::less<duckdb::string_t>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_long>_>_>_>
               ::operator[](target->hist,(key_type *)(p_Var4 + 1));
      *pmVar3 = (long)&p_Var1->_M_color + *pmVar3;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}